

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O3

BBox3fa * __thiscall
embree::sse2::BVHNRefitT<4,_embree::UserGeometry,_embree::Object>::leafBounds
          (BBox3fa *__return_storage_ptr__,BVHNRefitT<4,_embree::UserGeometry,_embree::Object> *this
          ,NodeRef *ref)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  BBox3fa box;
  void *local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined1 *local_80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar1 = ref->ptr;
  if (uVar1 == 8) {
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
    local_68 = _DAT_01f7aa00;
  }
  else {
    uVar3 = (ulong)((uint)uVar1 & 0xf);
    local_68 = _DAT_01f7aa00;
    local_78 = _DAT_01f7a9f0;
    if (uVar3 != 8) {
      lVar2 = 0;
      do {
        local_88 = *(undefined4 *)((uVar1 & 0xfffffffffffffff0) + 4 + lVar2 * 8);
        local_90 = (this->mesh->super_AccelSet).super_Geometry.userPtr;
        local_84 = 0;
        local_80 = local_58;
        (**(code **)&(this->mesh->super_AccelSet).super_Geometry.field_0x58)(&local_90);
        local_78.m128 = (__m128)minps(local_78.m128,local_58);
        local_68.m128 = (__m128)maxps(local_68.m128,local_48);
        lVar2 = lVar2 + 1;
      } while (uVar3 - 8 != lVar2);
    }
    (__return_storage_ptr__->lower).field_0 = local_78;
  }
  (__return_storage_ptr__->upper).field_0 = local_68;
  return __return_storage_ptr__;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }